

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffbfwt(FITSfile *Fptr,int nbuff,int *status)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (Fptr->writemode == 0) {
    ffpmsg("Error: trying to write to READONLY file.");
    if (Fptr->driver == 8) {
      ffpmsg("Cannot write to a GZIP or COMPRESS compressed file.");
    }
    Fptr->dirty[nbuff] = 0;
    *status = 0x70;
    iVar3 = 0x70;
  }
  else {
    lVar6 = Fptr->bufrecnum[nbuff] * 0xb40;
    lVar1 = Fptr->filesize;
    if (lVar6 - lVar1 == 0 || lVar6 < lVar1) {
      if (Fptr->io_pos != lVar6) {
        ffseek(Fptr,lVar6);
      }
      ffwrite(Fptr,0xb40,Fptr->iobuffer + nbuff * 0xb40,status);
      Fptr->io_pos = lVar6 + 0xb40;
      if (lVar6 - Fptr->filesize == 0) {
        Fptr->filesize = Fptr->filesize + 0xb40;
      }
      Fptr->dirty[nbuff] = 0;
    }
    else {
      if (Fptr->io_pos != lVar1) {
        ffseek(Fptr,lVar1);
      }
      if (nbuff != 0x28) {
        do {
          lVar1 = Fptr->filesize;
          lVar6 = Fptr->bufrecnum[nbuff];
          uVar2 = 0;
          uVar4 = (ulong)(uint)nbuff;
          do {
            lVar5 = Fptr->bufrecnum[uVar2];
            if (lVar1 / 0xb40 <= lVar5 && lVar5 < lVar6) {
              uVar4 = uVar2 & 0xffffffff;
              lVar6 = lVar5;
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 != 0x28);
          lVar6 = lVar6 * 0xb40;
          lVar5 = lVar6 - lVar1;
          if (lVar5 != 0 && lVar1 <= lVar6) {
            if (0xb3f < lVar5) {
              lVar5 = lVar5 / 0xb40;
              do {
                if (*status != 0) break;
                ffwrite(Fptr,0xb40,ffbfwt::zeros,status);
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
            }
            Fptr->filesize = lVar6;
          }
          iVar3 = (int)uVar4;
          ffwrite(Fptr,0xb40,Fptr->iobuffer + iVar3 * 0xb40,status);
          Fptr->dirty[iVar3] = 0;
          Fptr->filesize = Fptr->filesize + 0xb40;
        } while (iVar3 != nbuff);
      }
      Fptr->io_pos = Fptr->filesize;
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffbfwt(FITSfile *Fptr,        /* I - FITS file pointer           */
           int nbuff,             /* I - which buffer to write          */
           int *status)           /* IO - error status                  */
{
/*
  write contents of buffer to file;  If the position of the buffer
  is beyond the current EOF, then the file may need to be extended
  with fill values, and/or with the contents of some of the other
  i/o buffers.
*/
    int  ii,ibuff;
    long jj, irec, minrec, nloop;
    LONGLONG filepos;

    static char zeros[IOBUFLEN];  /*  initialized to zero by default */

    if (!(Fptr->writemode) )
    {
        ffpmsg("Error: trying to write to READONLY file.");
        if (Fptr->driver == 8) {  /* gzip compressed file */
	  ffpmsg("Cannot write to a GZIP or COMPRESS compressed file.");
	}
        Fptr->dirty[nbuff] = FALSE;  /* reset buffer status to prevent later probs */
        *status = READONLY_FILE;
        return(*status);
    }

    filepos = (LONGLONG)Fptr->bufrecnum[nbuff] * IOBUFLEN;

    if (filepos <= Fptr->filesize)
    {
      /* record is located within current file, so just write it */

      /* move to the correct write position */
      if (Fptr->io_pos != filepos)
         ffseek(Fptr, filepos);

      ffwrite(Fptr, IOBUFLEN, Fptr->iobuffer + (nbuff * IOBUFLEN), status);
      Fptr->io_pos = filepos + IOBUFLEN;

      if (filepos == Fptr->filesize)   /* appended new record? */
         Fptr->filesize += IOBUFLEN;   /* increment the file size */

      Fptr->dirty[nbuff] = FALSE;
    }

    else  /* if record is beyond the EOF, append any other records */ 
          /* and/or insert fill values if necessary */
    {
      /* move to EOF */
      if (Fptr->io_pos != Fptr->filesize)
         ffseek(Fptr, Fptr->filesize);

      ibuff = NIOBUF;  /* initialize to impossible value */
      while(ibuff != nbuff) /* repeat until requested buffer is written */
      {
        minrec = (long) (Fptr->filesize / IOBUFLEN);

        /* write lowest record beyond the EOF first */

        irec = Fptr->bufrecnum[nbuff]; /* initially point to the requested buffer */
        ibuff = nbuff;

        for (ii = 0; ii < NIOBUF; ii++)
        {
          if (Fptr->bufrecnum[ii] >= minrec &&
            Fptr->bufrecnum[ii] < irec)
          {
            irec = Fptr->bufrecnum[ii];  /* found a lower record */
            ibuff = ii;
          }
        }

        filepos = (LONGLONG)irec * IOBUFLEN;  /* byte offset of record in file */

        /* append 1 or more fill records if necessary */
        if (filepos > Fptr->filesize)
        {                    
          nloop = (long) ((filepos - (Fptr->filesize)) / IOBUFLEN); 
          for (jj = 0; jj < nloop && !(*status); jj++)
            ffwrite(Fptr, IOBUFLEN, zeros, status);

/*
ffseek(Fptr, filepos);
*/
          Fptr->filesize = filepos;   /* increment the file size */
        } 

        /* write the buffer itself */
        ffwrite(Fptr, IOBUFLEN, Fptr->iobuffer + (ibuff * IOBUFLEN), status);
        Fptr->dirty[ibuff] = FALSE;

        Fptr->filesize += IOBUFLEN;     /* increment the file size */
      } /* loop back if more buffers need to be written */

      Fptr->io_pos = Fptr->filesize;  /* currently positioned at EOF */
    }

    return(*status);       
}